

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peer.cpp
# Opt level: O3

void __thiscall Peer::disconnect(Peer *this,bool suppressException)

{
  long lVar1;
  Socket __fd;
  int iVar2;
  Events *this_00;
  unique_ptr<Event,_std::default_delete<Event>_> *puVar3;
  Peers *this_01;
  long *plVar4;
  long *plVar5;
  int *piVar6;
  long *plVar7;
  ulong *puVar8;
  ulong *puVar9;
  undefined8 local_c0;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __fd = SocketResource::resource(&this->m_socket);
  iVar2 = shutdown(__fd,2);
  if (iVar2 != -1 || suppressException) {
    this->m_connected = false;
    this_00 = P2PSocket::events(this->m_master);
    puVar3 = Events::onPeerDisconnect(this_00);
    Event::trigger<Peer*>
              ((puVar3->_M_t).super___uniq_ptr_impl<Event,_std::default_delete<Event>_>._M_t.
               super__Tuple_impl<0UL,_Event_*,_std::default_delete<Event>_>.
               super__Head_base<0UL,_Event_*,_false>._M_head_impl,this);
    this_01 = P2PSocket::peers(this->m_master);
    Peers::remove(this_01,(char *)this);
    return;
  }
  plVar4 = (long *)__cxa_allocate_exception(0x20);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"Failed to shutdown socket to peer ","");
  std::operator+(&local_50,&local_b0,&this->m_name);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_90 = (long *)*plVar5;
  plVar7 = plVar5 + 2;
  if (local_90 == plVar7) {
    local_80 = *plVar7;
    lStack_78 = plVar5[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar7;
  }
  local_88 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  piVar6 = __errno_location();
  strerror(*piVar6);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_70 = (long *)*plVar5;
  plVar7 = plVar5 + 2;
  if (local_70 == plVar7) {
    local_60 = *plVar7;
    lStack_58 = plVar5[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar7;
  }
  local_68 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
  puVar8 = (ulong *)*plVar5;
  puVar9 = (ulong *)(plVar5 + 2);
  if (puVar8 == puVar9) {
    local_c0 = *puVar9;
    uStack_b8 = (undefined4)plVar5[3];
    uStack_b4 = *(undefined4 *)((long)plVar5 + 0x1c);
    puVar8 = &local_c0;
  }
  else {
    local_c0 = *puVar9;
  }
  lVar1 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  *plVar4 = (long)(plVar4 + 2);
  if (puVar8 == &local_c0) {
    *(undefined4 *)(plVar4 + 2) = (undefined4)local_c0;
    *(undefined4 *)((long)plVar4 + 0x14) = local_c0._4_4_;
    *(undefined4 *)(plVar4 + 3) = uStack_b8;
    *(undefined4 *)((long)plVar4 + 0x1c) = uStack_b4;
  }
  else {
    *plVar4 = (long)puVar8;
    plVar4[2] = local_c0;
  }
  plVar4[1] = lVar1;
  local_c0 = local_c0 & 0xffffffffffffff00;
  __cxa_throw(plVar4,&PeerException::typeinfo,PeerException::~PeerException);
}

Assistant:

void Peer::disconnect(bool suppressException)
{
    int shutdown = ::shutdown(m_socket.resource(), SHUT_RDWR);
    if (shutdown == -1 && !suppressException) {
        throw PeerException(std::string{"Failed to shutdown socket to peer "} + m_name + " " +
                            std::strerror(errno) + "\n");
    }

    // Don't call close here, it will be triggered automatically when object gets destroyed
    m_connected = false;
    this->m_master->events()->onPeerDisconnect()->trigger(this);
    this->m_master->peers()->remove(this);
}